

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

int NGA_Create_ghosts_config
              (int type,int ndim,int *dims,int *width,char *name,int *chunk,int p_handle)

{
  ulong uVar1;
  Integer *chunk_00;
  logical lVar2;
  int iVar3;
  ulong uVar4;
  Integer g_a;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  
  iVar3 = 0;
  if (ndim < 8) {
    uVar4 = (ulong)(uint)ndim;
    uVar1 = uVar4;
    if (0 < ndim) {
      do {
        _ga_dims[uVar1 - 1] = (long)*dims;
        dims = dims + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    uVar1 = uVar4;
    if (0 < ndim) {
      do {
        _ga_width[uVar1 - 1] = (long)*width;
        width = width + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    if (chunk == (int *)0x0) {
      chunk_00 = (Integer *)0x0;
    }
    else {
      chunk_00 = _ga_work;
      if (0 < ndim) {
        do {
          uVar4 = uVar4 - 1;
          _ga_work[uVar4] = (long)*chunk;
          chunk = chunk + 1;
        } while (uVar4 != 0);
      }
    }
    lVar2 = pnga_create_ghosts_config
                      ((long)type,(long)ndim,_ga_dims,_ga_width,name,chunk_00,(long)p_handle,&g_a);
    iVar3 = 0;
    if (lVar2 == 1) {
      iVar3 = (int)g_a;
    }
  }
  return iVar3;
}

Assistant:

int NGA_Create_ghosts_config(int type, int ndim,int dims[], int width[], char *name,
    int chunk[], int p_handle)
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(width,_ga_width, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create_ghosts_config((Integer)type, (Integer)ndim, _ga_dims,
        _ga_width, name, ptr, (Integer)p_handle, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}